

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.cc
# Opt level: O0

void * malloc(size_t __size)

{
  bool bVar1;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *pAVar2;
  size_t sVar3;
  smallsizeclass_t sVar4;
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *this;
  undefined8 *in_FS_OFFSET;
  size_t result;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  p;
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *fl;
  smallsizeclass_t sizeclass;
  FreeListKey *key;
  anon_class_8_1_8991fb9c domesticate;
  Alloc<void> r;
  size_t in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *sizeclass_00;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *key_00;
  anon_class_8_1_8991fb9c domesticate_00;
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *in_stack_fffffffffffffe90;
  smallsizeclass_t in_stack_fffffffffffffe98;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this_00;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_150;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_d0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_70;
  
  sizeclass_00 = *(Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                   **)*in_FS_OFFSET;
  snmalloc::is_small_sizeclass(in_stack_fffffffffffffe50);
  pAVar2 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
           (__size - 1);
  domesticate_00.this = sizeclass_00;
  this_00 = sizeclass_00;
  sVar3 = snmalloc::sizeclass_to_size((smallsizeclass_t)sizeclass_00);
  if ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
      (sVar3 - 1) < pAVar2) {
    local_150 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                 *)snmalloc::
                   Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                   ::alloc_not_small<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>
                             ((size_t)domesticate_00.this,pAVar2);
  }
  else {
    key_00 = sizeclass_00;
    sVar4 = snmalloc::size_to_sizeclass(in_stack_fffffffffffffe48);
    this = (sizeclass_00->super_FastFreeLists).small_fast_free_lists + sVar4;
    bVar1 = snmalloc::freelist::
            Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
            ::empty(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pAVar2 = sizeclass_00;
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      message_queue((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                     *)0x103814);
      bVar1 = snmalloc::RemoteAllocator::can_dequeue((RemoteAllocator *)0x10381c);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_70 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                    *)snmalloc::
                      Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                      ::
                      handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*)_1_,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*>
                                (pAVar2,sizeclass_00,sVar4,this);
      }
      else {
        local_70 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                    *)snmalloc::
                      Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                      ::small_alloc<(snmalloc::ZeroMem)0,_snmalloc::CheckInitPthread>::
                      anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)this_00,
                                 (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                                  *)__size,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      }
      local_d0 = local_70;
    }
    else {
      local_d0 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                  *)snmalloc::freelist::
                    Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
                    ::
                    take<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)0,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_>
                              ((Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                                *)pAVar2,(FreeListKey *)key_00,domesticate_00);
    }
    local_150 = local_d0;
  }
  return local_150;
}

Assistant:

SNMALLOC_EXPORT void* SNMALLOC_NAME_MANGLE(malloc)(size_t size)
  {
    return snmalloc::libc::malloc(size);
  }